

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_optimizePureApplication
          (sysbvm_context_t *context,sysbvm_astFunctionApplicationNode_t **applicationNode)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_astFunctionApplicationNode_t *psVar3;
  uint uVar4;
  sysbvm_bitflags_t applicationFlags;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  anon_struct_40_5_99cd4f77 gcFrame;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_tuple_t local_148;
  ulong *puStack_140;
  sysbvm_tuple_t local_138;
  sysbvm_tuple_t sStack_130;
  undefined8 local_128;
  sysbvm_stackFrameRecord_t local_118;
  undefined8 local_108;
  undefined1 *puStack_100;
  sysbvm_stackFrameRecord_t local_f8;
  undefined8 local_e8;
  anon_struct_136_2_7a050327_for_gcRoots *paStack_e0;
  sysbvm_functionCallFrameStack_t local_d8;
  
  puStack_100 = (undefined1 *)&local_148;
  local_138 = 0;
  sStack_130 = 0;
  local_148 = 0;
  puStack_140 = (ulong *)0x0;
  local_128 = 0;
  local_118.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_118.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_118._12_4_ = 0;
  local_108 = 5;
  sysbvm_stackFrame_pushRecord(&local_118);
  _Var2 = sysbvm_astNode_isLiteralNode(context,(*applicationNode)->functionExpression);
  if (!_Var2) {
    _Var2 = false;
    goto LAB_00122974;
  }
  puStack_140 = (ulong *)sysbvm_astLiteralNode_getValue((*applicationNode)->functionExpression);
  if (((ulong)puStack_140 & 0xf) == 0 && puStack_140 != (ulong *)0x0) {
    uVar6 = *puStack_140;
    if (((uVar6 & 0xf) == 0 && uVar6 != 0) && ((*(byte *)(uVar6 + 8) & 0x80) == 0)) {
      uVar6 = *(ulong *)(uVar6 + 0x70);
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
        uVar4 = (uint)((long)uVar6 >> 4);
      }
      else {
        uVar4 = (uint)*(undefined8 *)(uVar6 + 0x10);
      }
    }
    else {
      uVar4 = 0;
    }
    if ((uVar4 >> 0xc & 1) == 0) goto LAB_0012296c;
    uVar6 = puStack_140[5];
    if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
      uVar4 = (uint)((long)uVar6 >> 4);
    }
    else {
      uVar4 = (uint)*(undefined8 *)(uVar6 + 0x10);
    }
  }
  else {
LAB_0012296c:
    uVar4 = 0;
  }
  _Var2 = SUB41((uVar4 & 8) >> 3,0);
LAB_00122974:
  uVar6 = (*applicationNode)->arguments;
  if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
    uVar6 = (ulong)(*(uint *)(uVar6 + 0xc) >> 3);
  }
  else {
    uVar6 = 0;
  }
  if ((uVar6 != 0 & _Var2) == 1) {
    uVar5 = 1;
    do {
      uVar1 = (*applicationNode)->arguments;
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_148 = *(sysbvm_tuple_t *)(uVar1 + 8 + uVar5 * 8);
      }
      else {
        local_148 = 0;
      }
      _Var2 = sysbvm_astNode_isLiteralNode(context,local_148);
    } while ((_Var2) && (bVar7 = uVar5 < uVar6, uVar5 = uVar5 + 1, bVar7));
  }
  if (_Var2 == false) {
    sysbvm_stackFrame_popRecord(&local_118);
    psVar3 = *applicationNode;
  }
  else {
    memset(&local_d8,0,0xb0);
    local_f8.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_f8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_f8._12_4_ = 0;
    local_e8 = 0x11;
    paStack_e0 = &local_d8.gcRoots;
    sysbvm_stackFrame_pushRecord(&local_f8);
    uVar5 = (*applicationNode)->applicationFlags;
    if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
      applicationFlags = (long)uVar5 >> 4;
    }
    else {
      applicationFlags = *(sysbvm_bitflags_t *)(uVar5 + 0x10);
    }
    sysbvm_functionCallFrameStack_begin
              (context,&local_d8,(sysbvm_tuple_t)puStack_140,uVar6,applicationFlags);
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        uVar1 = (*applicationNode)->arguments;
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          local_148 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
        }
        else {
          local_148 = 0;
        }
        sStack_130 = sysbvm_astLiteralNode_getValue(local_148);
        sysbvm_functionCallFrameStack_push(&local_d8,sStack_130);
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    sysbvm_stackFrame_popRecord(&local_f8);
    local_138 = sysbvm_functionCallFrameStack_finish(context,&local_d8);
    sysbvm_stackFrame_popRecord(&local_118);
    psVar3 = (sysbvm_astFunctionApplicationNode_t *)
             sysbvm_astLiteralNode_create
                       (context,((*applicationNode)->super).sourcePosition,local_138);
  }
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_optimizePureApplication(sysbvm_context_t *context, sysbvm_astFunctionApplicationNode_t **applicationNode)
{
    struct {
        sysbvm_tuple_t argumentNode;
        
        sysbvm_tuple_t literalFunction;
        sysbvm_tuple_t pureCallResult;
        sysbvm_tuple_t argumentValue;
        sysbvm_tuple_t functionType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    bool canOptimizeCall = false;
    if(sysbvm_astNode_isLiteralNode(context, (*applicationNode)->functionExpression))
    {
        gcFrame.literalFunction = sysbvm_astLiteralNode_getValue((*applicationNode)->functionExpression);
        canOptimizeCall = sysbvm_function_isPure(context, gcFrame.literalFunction);
    }

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    for(size_t i = 0; canOptimizeCall && i < applicationArgumentCount ; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        canOptimizeCall = canOptimizeCall && sysbvm_astNode_isLiteralNode(context, gcFrame.argumentNode);
    }

    if(!canOptimizeCall)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)*applicationNode;
    }

    // Optimize pure function call
    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.literalFunction, applicationArgumentCount, sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags));

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        gcFrame.argumentValue = sysbvm_astLiteralNode_getValue(gcFrame.argumentNode);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argumentValue);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.pureCallResult = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_astLiteralNode_create(context, (*applicationNode)->super.sourcePosition, gcFrame.pureCallResult);
}